

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O0

void __thiscall
GuidedMeshNormalFiltering::getRadiusBasedFaceNeighbor
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,FaceHandle fh,double radius,
          vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *face_neighbor)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  reference rVar6;
  reference local_178;
  vector_type local_168;
  double local_150;
  double distance;
  undefined1 local_140 [8];
  Point cj;
  BaseHandle local_118;
  int local_114;
  FaceHandle temp_face_handle;
  int i;
  undefined1 local_108 [4];
  FaceHandle temp_face_handle_queue;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> temp_face_neighbor;
  queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  queue_face_handle;
  allocator<bool> local_7a;
  bool local_79;
  undefined1 local_78 [8];
  vector<bool,_std::allocator<bool>_> flag;
  undefined1 local_48 [8];
  Point ci;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *face_neighbor_local;
  double radius_local;
  TriMesh *mesh_local;
  GuidedMeshNormalFiltering *this_local;
  FaceHandle fh_local;
  
  flag.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ._4_4_ = fh.super_BaseHandle.idx_;
  ci.super_VectorDataT<double,_3>.values_[2] = (double)face_neighbor;
  this_local._4_4_ = fh.super_BaseHandle.idx_;
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::calc_face_centroid
            ((Point *)local_48,
             (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)mesh,(FaceHandle)fh.super_BaseHandle.idx_);
  iVar2 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))();
  local_79 = false;
  std::allocator<bool>::allocator(&local_7a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_78,(long)iVar2,&local_79,&local_7a);
  std::allocator<bool>::~allocator(&local_7a);
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::clear
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
             ci.super_VectorDataT<double,_3>.values_[2]);
  iVar2 = OpenMesh::BaseHandle::idx((BaseHandle *)((long)&this_local + 4));
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)local_78,(long)iVar2);
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)rVar6._M_p;
  std::_Bit_reference::operator=
            ((_Bit_reference *)
             &queue_face_handle.c.
              super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node,true);
  std::
  queue<OpenMesh::FaceHandle,std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>>
  ::queue<std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>,void>
            ((queue<OpenMesh::FaceHandle,std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>>
              *)&temp_face_neighbor.
                 super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  ::push((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
          *)&temp_face_neighbor.
             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,(value_type *)((long)&this_local + 4));
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_108);
  while( true ) {
    bVar1 = std::
            queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
            ::empty((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                     *)&temp_face_neighbor.
                        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar3 = std::
             queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
             ::front((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                      *)&temp_face_neighbor.
                         super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    i = (pvVar3->super_BaseHandle).idx_;
    bVar1 = OpenMesh::BaseHandle::operator!=((BaseHandle *)&i,(BaseHandle *)((long)&this_local + 4))
    ;
    if (bVar1) {
      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
                ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                 ci.super_VectorDataT<double,_3>.values_[2],(value_type *)&i);
    }
    std::
    queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
    ::pop((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
           *)&temp_face_neighbor.
              super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
    temp_face_handle.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)i;
    getVertexBasedFaceNeighbor
              (this,mesh,(FaceHandle)i,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_108);
    local_114 = 0;
    while( true ) {
      iVar2 = local_114;
      sVar4 = std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::size
                        ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                         local_108);
      if ((int)sVar4 <= iVar2) break;
      pvVar5 = std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::operator[]
                         ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                          local_108,(long)local_114);
      local_118.idx_ = (pvVar5->super_BaseHandle).idx_;
      iVar2 = OpenMesh::BaseHandle::idx(&local_118);
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_78,(long)iVar2);
      cj.super_VectorDataT<double,_3>.values_[2] = (double)rVar6._M_p;
      bVar1 = std::_Bit_reference::operator_cast_to_bool
                        ((_Bit_reference *)(cj.super_VectorDataT<double,_3>.values_ + 2));
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        distance._4_4_ = local_118.idx_;
        OpenMesh::
        PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
        ::calc_face_centroid
                  ((Point *)local_140,
                   (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                    *)mesh,(FaceHandle)local_118.idx_);
        OpenMesh::VectorT<double,_3>::operator-
                  (&local_168,(VectorT<double,_3> *)local_48,(vector_type *)local_140);
        local_150 = OpenMesh::VectorT<double,_3>::length(&local_168);
        if (local_150 <= radius) {
          std::
          queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
          ::push((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
                  *)&temp_face_neighbor.
                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&local_118);
        }
        iVar2 = OpenMesh::BaseHandle::idx(&local_118);
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_78,(long)iVar2);
        local_178 = rVar6;
        std::_Bit_reference::operator=(&local_178,true);
      }
      local_114 = local_114 + 1;
    }
  }
  std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~vector
            ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)local_108);
  std::
  queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  ::~queue((queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
            *)&temp_face_neighbor.
               super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_78)
  ;
  return;
}

Assistant:

void GuidedMeshNormalFiltering::getRadiusBasedFaceNeighbor(TriMesh &mesh, TriMesh::FaceHandle fh, double radius, std::vector<TriMesh::FaceHandle> &face_neighbor)
{
    TriMesh::Point ci = mesh.calc_face_centroid(fh);
    std::vector<bool> flag((int)mesh.n_faces(), false);

    face_neighbor.clear();
    flag[fh.idx()] = true;
    std::queue<TriMesh::FaceHandle> queue_face_handle;
    queue_face_handle.push(fh);

    std::vector<TriMesh::FaceHandle> temp_face_neighbor;
    while(!queue_face_handle.empty())
    {
        TriMesh::FaceHandle temp_face_handle_queue = queue_face_handle.front();
        if(temp_face_handle_queue != fh)
            face_neighbor.push_back(temp_face_handle_queue);
        queue_face_handle.pop();
        getVertexBasedFaceNeighbor(mesh, temp_face_handle_queue, temp_face_neighbor);
        for(int i = 0; i < (int)temp_face_neighbor.size(); i++)
        {
            TriMesh::FaceHandle temp_face_handle = temp_face_neighbor[i];
            if(!flag[temp_face_handle.idx()])
            {
                TriMesh::Point cj = mesh.calc_face_centroid(temp_face_handle);
                double distance = (ci - cj).length();
                if(distance <= radius)
                    queue_face_handle.push(temp_face_handle);
                flag[temp_face_handle.idx()] = true;
            }
        }
    }
}